

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *this_00;
  ostream *poVar1;
  Scalar *pSVar2;
  istream *this_01;
  undefined1 local_d8 [8];
  lmik solver;
  Scalar local_78;
  Scalar local_70;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_68;
  undefined1 local_48 [8];
  Vector2d ans;
  Vector2d X;
  Vector2d q;
  
  this = (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
         (X.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array + 1)
  ;
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)this);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
            ((Matrix<double,_2,_1,_0,_2,_1> *)
             (ans.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)local_48);
  local_70 = 1.5707963267948966;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<(&local_68,this,&local_70);
  local_78 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_68,&local_78);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter the target position (x, y)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
            (ans.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
            + 1);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()(this_00,0);
  this_01 = (istream *)std::istream::operator>>((istream *)&std::cin,pSVar2);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()(this_00,1);
  std::istream::operator>>(this_01,pSVar2);
  lmik::lmik((lmik *)local_d8);
  lmik::solve((lmik *)local_d8,
              (Vector2d *)
              (X.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
              + 1),(Vector2d *)this_00);
  poVar1 = std::operator<<((ostream *)&std::cout,"q(0): ");
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                      (X.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                       m_data.array + 1),0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pSVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"q(1): ");
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                      (X.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                       m_data.array + 1),1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pSVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  lmik::~lmik((lmik *)local_d8);
  return 0;
}

Assistant:

int main() {    
    Vector2d q, X, ans;
    q << M_PI_2, 0;
    
    cout << "Enter the target position (x, y)" << endl;
    cin >> X(0) >> X(1);

    lmik solver;
    solver.solve(q, X);
    cout << "q(0): " << q(0) << endl;
    cout << "q(1): " << q(1) << endl;
    
    return 0;
}